

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  ushort uVar2;
  stbi__uint16 sVar3;
  uint uVar4;
  stbi__uint16 *psVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ushort *puVar9;
  long lVar10;
  ulong uVar11;
  ushort *puVar12;
  ulong uVar13;
  ulong uVar14;
  
  psVar5 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                    ,0x661,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    psVar5 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar5 == (stbi__uint16 *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      psVar5 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar4 = req_comp + img_n * 8;
        if ((0x23 < uVar4) || ((0xe161a1c00U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                        ,0x67e,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar1 = x - 1;
        uVar8 = 1;
        if (1 < (int)y) {
          uVar8 = (ulong)y;
        }
        uVar13 = 0;
        uVar14 = 0;
        uVar11 = 0;
        do {
          iVar6 = (int)uVar11 * x;
          puVar12 = data + (uint)(iVar6 * img_n);
          puVar9 = psVar5 + (uint)(iVar6 * req_comp);
          switch(uVar4) {
          case 10:
            if (-1 < iVar1) {
              lVar10 = 0;
              uVar7 = x;
              do {
                psVar5[uVar14 + lVar10] = *(stbi__uint16 *)((long)data + lVar10 + uVar13 * 2);
                psVar5[uVar14 + lVar10 + 1] = 0xffff;
                uVar7 = uVar7 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar7);
            }
            break;
          case 0xb:
            if (-1 < iVar1) {
              puVar9 = psVar5 + uVar14 + 2;
              uVar7 = x;
              do {
                uVar2 = *puVar12;
                *puVar9 = uVar2;
                puVar9[-1] = uVar2;
                puVar9[-2] = uVar2;
                puVar12 = puVar12 + 1;
                uVar7 = uVar7 - 1;
                puVar9 = puVar9 + 3;
              } while (0 < (int)uVar7);
            }
            break;
          case 0xc:
            if (-1 < iVar1) {
              lVar10 = 0;
              uVar7 = x;
              do {
                sVar3 = *(stbi__uint16 *)((long)data + lVar10 + uVar13 * 2);
                psVar5[uVar14 + lVar10 * 2 + 2] = sVar3;
                psVar5[uVar14 + lVar10 * 2 + 1] = sVar3;
                psVar5[uVar14 + lVar10 * 2] = sVar3;
                psVar5[uVar14 + lVar10 * 2 + 3] = 0xffff;
                uVar7 = uVar7 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar7);
            }
            break;
          default:
            uVar7 = x;
            if (-1 < iVar1) {
              do {
                *puVar9 = *puVar12;
                puVar9[1] = puVar12[1];
                puVar9[2] = puVar12[2];
                puVar12 = puVar12 + 4;
                puVar9 = puVar9 + 3;
                uVar7 = uVar7 - 1;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x11:
            if (-1 < iVar1) {
              lVar10 = 0;
              uVar7 = x;
              do {
                *(stbi__uint16 *)((long)psVar5 + lVar10 + uVar14 * 2) = data[uVar13 + lVar10];
                uVar7 = uVar7 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x13:
            if (-1 < iVar1) {
              puVar9 = psVar5 + uVar14 + 2;
              uVar7 = x;
              do {
                uVar2 = *puVar12;
                *puVar9 = uVar2;
                puVar9[-1] = uVar2;
                puVar9[-2] = uVar2;
                puVar12 = puVar12 + 2;
                uVar7 = uVar7 - 1;
                puVar9 = puVar9 + 3;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x14:
            if (-1 < iVar1) {
              lVar10 = 0;
              uVar7 = x;
              do {
                sVar3 = *(stbi__uint16 *)((long)data + lVar10 + uVar13 * 2);
                psVar5[uVar14 + lVar10 + 2] = sVar3;
                psVar5[uVar14 + lVar10 + 1] = sVar3;
                psVar5[uVar14 + lVar10] = sVar3;
                psVar5[uVar14 + lVar10 + 3] =
                     *(stbi__uint16 *)((long)data + lVar10 + uVar13 * 2 + 2);
                uVar7 = uVar7 - 1;
                lVar10 = lVar10 + 4;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x19:
            uVar7 = x;
            if (-1 < iVar1) {
              do {
                uVar2 = puVar12[2];
                *puVar9 = (ushort)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                                   (uint)puVar12[1] * 0x96 + (uint)*puVar12 * 0x4d >> 8);
                puVar12 = puVar12 + 3;
                puVar9 = puVar9 + 1;
                uVar7 = uVar7 - 1;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x1a:
            uVar7 = x;
            if (-1 < iVar1) {
              do {
                uVar2 = puVar12[2];
                *puVar9 = (ushort)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                                   (uint)puVar12[1] * 0x96 + (uint)*puVar12 * 0x4d >> 8);
                puVar9[1] = 0xffff;
                puVar12 = puVar12 + 3;
                puVar9 = puVar9 + 2;
                uVar7 = uVar7 - 1;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x1c:
            uVar7 = x;
            if (-1 < iVar1) {
              do {
                *puVar9 = *puVar12;
                puVar9[1] = puVar12[1];
                puVar9[2] = puVar12[2];
                puVar9[3] = 0xffff;
                puVar12 = puVar12 + 3;
                puVar9 = puVar9 + 4;
                uVar7 = uVar7 - 1;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x21:
            if (-1 < iVar1) {
              lVar10 = 0;
              uVar7 = x;
              do {
                uVar2 = data[uVar13 + lVar10 * 2 + 2];
                *(short *)((long)psVar5 + lVar10 + uVar14 * 2) =
                     (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                             (uint)data[uVar13 + lVar10 * 2 + 1] * 0x96 +
                             (uint)data[uVar13 + lVar10 * 2] * 0x4d >> 8);
                uVar7 = uVar7 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar7);
            }
            break;
          case 0x22:
            if (-1 < iVar1) {
              lVar10 = 0;
              uVar7 = x;
              do {
                uVar2 = data[uVar13 + lVar10 + 2];
                *(short *)((long)psVar5 + lVar10 + uVar14 * 2) =
                     (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                             (uint)data[uVar13 + lVar10 + 1] * 0x96 +
                             (uint)data[uVar13 + lVar10] * 0x4d >> 8);
                *(stbi__uint16 *)((long)psVar5 + lVar10 + uVar14 * 2 + 2) =
                     data[uVar13 + lVar10 + 3];
                uVar7 = uVar7 - 1;
                lVar10 = lVar10 + 4;
              } while (0 < (int)uVar7);
            }
          }
          uVar11 = uVar11 + 1;
          uVar14 = (ulong)((int)uVar14 + req_comp * x);
          uVar13 = (ulong)((int)uVar13 + x * img_n);
        } while (uVar11 != uVar8);
      }
      free(data);
    }
  }
  return psVar5;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}